

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

float stbir__filter_cubic(float x,float s)

{
  float fVar1;
  double dVar2;
  float s_local;
  float x_local;
  
  dVar2 = std::fabs((double)(ulong)(uint)x);
  fVar1 = SUB84(dVar2,0);
  if (1.0 <= fVar1) {
    if (2.0 <= fVar1) {
      s_local = 0.0;
    }
    else {
      s_local = (fVar1 * (fVar1 * (6.0 - fVar1) + -12.0) + 8.0) / 6.0;
    }
  }
  else {
    s_local = (fVar1 * fVar1 * (fVar1 * 3.0 + -6.0) + 4.0) / 6.0;
  }
  return s_local;
}

Assistant:

static float stbir__filter_cubic(float x, float s)
{
    STBIR__UNUSED_PARAM(s);

    x = (float)fabs(x);

    if (x < 1.0f)
        return (4 + x*x*(3*x - 6))/6;
    else if (x < 2.0f)
        return (8 + x*(-12 + x*(6 - x)))/6;

    return (0.0f);
}